

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O0

void yprp_inout(lys_ypr_ctx_conflict *pctx,lysp_node_action_inout *inout,int8_t *flag)

{
  ly_stmt substmt;
  lysp_node *local_60;
  lysp_ext_instance *local_50;
  lysp_node_grp *local_38;
  lysp_node_grp *grp;
  lysp_node *data;
  uint64_t u;
  int8_t *flag_local;
  lysp_node_action_inout *inout_local;
  lys_ypr_ctx_conflict *pctx_local;
  
  if (inout->child != (lysp_node *)0x0) {
    ypr_close_parent(pctx,flag);
    ypr_open(pctx,(inout->field_0).node.name,(char *)0x0,(char *)0x0,*flag);
    (pctx->field_0).field_0.level = (pctx->field_0).field_0.level + 1;
    substmt = lyplg_ext_nodetype2stmt((inout->field_0).node.nodetype);
    yprp_extension_instances(pctx,substmt,'\0',(inout->field_0).node.exts,(int8_t *)0x0);
    data = (lysp_node *)0x0;
    while( true ) {
      if (inout->musts == (lysp_restr *)0x0) {
        local_50 = (lysp_ext_instance *)0x0;
      }
      else {
        local_50 = inout->musts[-1].exts;
      }
      if (local_50 <= data) break;
      yprp_restr(pctx,inout->musts + (long)data,LY_STMT_MUST,"condition",(int8_t *)0x0);
      data = (lysp_node *)((long)&data->parent + 1);
    }
    data = (lysp_node *)0x0;
    while( true ) {
      if (inout->typedefs == (lysp_tpdf *)0x0) {
        local_60 = (lysp_node *)0x0;
      }
      else {
        local_60 = *(lysp_node **)&inout->typedefs[-1].flags;
      }
      if (local_60 <= data) break;
      yprp_typedef(pctx,inout->typedefs + (long)data);
      data = (lysp_node *)((long)&data->parent + 1);
    }
    for (local_38 = inout->groupings; local_38 != (lysp_node_grp *)0x0;
        local_38 = (local_38->field_0).field_1.next) {
      yprp_grouping(pctx,local_38);
    }
    for (grp = (lysp_node_grp *)inout->child; grp != (lysp_node_grp *)0x0;
        grp = (grp->field_0).field_1.next) {
      yprp_node(pctx,(lysp_node *)grp);
    }
    (pctx->field_0).field_0.level = (pctx->field_0).field_0.level - 1;
    ypr_close(pctx,(inout->field_0).node.name,'\x01');
  }
  return;
}

Assistant:

static void
yprp_inout(struct lys_ypr_ctx *pctx, const struct lysp_node_action_inout *inout, int8_t *flag)
{
    LY_ARRAY_COUNT_TYPE u;
    struct lysp_node *data;
    struct lysp_node_grp *grp;

    if (!inout->child) {
        /* input/output is empty */
        return;
    }
    ypr_close_parent(pctx, flag);

    ypr_open(pctx, inout->name, NULL, NULL, *flag);
    LEVEL++;

    yprp_extension_instances(pctx, lyplg_ext_nodetype2stmt(inout->nodetype), 0, inout->exts, NULL);
    LY_ARRAY_FOR(inout->musts, u) {
        yprp_restr(pctx, &inout->musts[u], LY_STMT_MUST, "condition", NULL);
    }
    LY_ARRAY_FOR(inout->typedefs, u) {
        yprp_typedef(pctx, &inout->typedefs[u]);
    }
    LY_LIST_FOR(inout->groupings, grp) {
        yprp_grouping(pctx, grp);
    }

    LY_LIST_FOR(inout->child, data) {
        yprp_node(pctx, data);
    }

    LEVEL--;
    ypr_close(pctx, inout->name, 1);
}